

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O1

ON_CONNECTION_CLOSED_EVENT_SUBSCRIPTION_HANDLE
connection_subscribe_on_connection_close_received
          (CONNECTION_HANDLE connection,ON_CONNECTION_CLOSE_RECEIVED on_connection_close_received,
          void *context)

{
  LOGGER_LOG p_Var1;
  
  if (connection == (CONNECTION_HANDLE)0x0 ||
      on_connection_close_received == (ON_CONNECTION_CLOSE_RECEIVED)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"connection_subscribe_on_connection_close_received",0x871,1,
                "Invalid arguments: connection = %p, on_connection_close_received = %p, context = %p"
                ,connection,on_connection_close_received,context);
      return (ON_CONNECTION_CLOSED_EVENT_SUBSCRIPTION_HANDLE)0x0;
    }
  }
  else {
    if ((connection->on_connection_close_received_event_subscription).on_connection_close_received
        == (ON_CONNECTION_CLOSE_RECEIVED)0x0) {
      (connection->on_connection_close_received_event_subscription).on_connection_close_received =
           on_connection_close_received;
      (connection->on_connection_close_received_event_subscription).context = context;
      return &connection->on_connection_close_received_event_subscription;
    }
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"connection_subscribe_on_connection_close_received",0x879,1,
                "Already subscribed for on_connection_close_received events");
      return (ON_CONNECTION_CLOSED_EVENT_SUBSCRIPTION_HANDLE)0x0;
    }
  }
  return (ON_CONNECTION_CLOSED_EVENT_SUBSCRIPTION_HANDLE)0x0;
}

Assistant:

ON_CONNECTION_CLOSED_EVENT_SUBSCRIPTION_HANDLE connection_subscribe_on_connection_close_received(CONNECTION_HANDLE connection, ON_CONNECTION_CLOSE_RECEIVED on_connection_close_received, void* context)
{
    ON_CONNECTION_CLOSED_EVENT_SUBSCRIPTION_HANDLE result;

    /* Codes_S_R_S_CONNECTION_01_279: [ `context` shall be allowed to be NULL. ]*/

    /* Codes_S_R_S_CONNECTION_01_277: [ If `connection` is NULL, `connection_subscribe_on_connection_close_received` shall fail and return NULL. ]*/
    if ((connection == NULL) ||
        /* Codes_S_R_S_CONNECTION_01_278: [ If `on_connection_close_received` is NULL, `connection_subscribe_on_connection_close_received` shall fail and return NULL. ]*/
        (on_connection_close_received == NULL))
    {
        LogError("Invalid arguments: connection = %p, on_connection_close_received = %p, context = %p",
            connection, on_connection_close_received, context);
        result = NULL;
    }
    else
    {
        if (connection->on_connection_close_received_event_subscription.on_connection_close_received != NULL)
        {
            /* Codes_S_R_S_CONNECTION_01_280: [ Only one subscription shall be allowed per connection, if a subsequent second even subscription is done while a subscription is active, `connection_subscribe_on_connection_close_received` shall fail and return NULL. ]*/
            LogError("Already subscribed for on_connection_close_received events");
            result = NULL;
        }
        else
        {
            /* Codes_S_R_S_CONNECTION_01_275: [ `connection_subscribe_on_connection_close_received` shall register the `on_connection_close_received` handler to be triggered whenever a CLOSE performative is received.. ]*/
            connection->on_connection_close_received_event_subscription.on_connection_close_received = on_connection_close_received;
            connection->on_connection_close_received_event_subscription.context = context;

            /* Codes_S_R_S_CONNECTION_01_276: [ On success, `connection_subscribe_on_connection_close_received` shall return a non-NULL handle to the event subcription. ]*/
            result = &connection->on_connection_close_received_event_subscription;
        }
    }

    return result;
}